

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

istream * embree::operator>>(istream *cin,Ref<embree::XML> *xml)

{
  StdStream *this;
  allocator local_72;
  allocator local_71;
  Ref<embree::Stream<int>_> local_70;
  XML *local_68;
  string local_60;
  string local_40;
  
  this = (StdStream *)::operator_new(0x70);
  std::__cxx11::string::string((string *)&local_40,"std::stream",&local_71);
  StdStream::StdStream(this,cin,&local_40);
  local_70.ptr = (Stream<int> *)this;
  (*(this->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this);
  std::__cxx11::string::string((string *)&local_60,"",&local_72);
  parseXML((embree *)&local_68,&local_70,&local_60,false,true);
  if (xml->ptr != (XML *)0x0) {
    (*(xml->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  xml->ptr = local_68;
  local_68 = (XML *)0x0;
  std::__cxx11::string::~string((string *)&local_60);
  if ((StdStream *)local_70.ptr != (StdStream *)0x0) {
    (*(((Stream<int> *)&(local_70.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_40);
  return cin;
}

Assistant:

std::istream& operator>>(std::istream& cin, Ref<XML>& xml) {
    xml = parseXML(new StdStream(cin),"",false,true);
    return cin;
  }